

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qauthenticator.cpp
# Opt level: O0

QByteArray * __thiscall
QAuthenticatorPrivate::digestMd5Response
          (QAuthenticatorPrivate *this,QByteArrayView challenge,QByteArrayView method,
          QByteArrayView path)

{
  QByteArrayView nonceCount;
  QByteArrayView cNonce;
  QByteArrayView qop_00;
  QByteArrayView method_00;
  QByteArrayView digestUri;
  QByteArrayView hEntity;
  bool bVar1;
  qsizetype qVar2;
  long in_RSI;
  QByteArray *in_RDI;
  storage_type *in_R8;
  qsizetype in_R9;
  long in_FS_OFFSET;
  storage_type *in_stack_00000008;
  qsizetype in_stack_00000010;
  QByteArray *credentials;
  QByteArray response;
  QByteArray qop;
  QByteArray opaque;
  QByteArray nonce;
  QByteArray nonceCountString;
  QHash<QByteArray,_QByteArray> options;
  QString *in_stack_fffffffffffffa28;
  QByteArray *in_stack_fffffffffffffa30;
  QByteArray *in_stack_fffffffffffffa38;
  QByteArrayView *in_stack_fffffffffffffa40;
  QHash<QByteArray,_QByteArray> *in_stack_fffffffffffffa48;
  QByteArrayView in_stack_fffffffffffffb10;
  QByteArray local_4a0 [2];
  QByteArray local_470 [3];
  QByteArray local_420 [2];
  undefined1 local_3e9;
  QStringBuilder<const_char_(&)[11],_QByteArray_&> local_3e8;
  QStringBuilder<const_char_(&)[9],_QByteArray_&> local_3d8;
  QStringBuilder<const_char_(&)[6],_QByteArrayView_&> local_3b0;
  QStringBuilder<const_char_(&)[8],_QByteArray_&> local_388;
  QByteArrayView in_stack_fffffffffffffd10;
  QByteArrayView in_stack_fffffffffffffd20;
  QByteArrayView in_stack_fffffffffffffd40;
  QByteArrayView in_stack_fffffffffffffd50;
  QByteArrayView in_stack_fffffffffffffd60;
  qsizetype in_stack_fffffffffffffd70;
  storage_type *in_stack_fffffffffffffd78;
  qsizetype in_stack_fffffffffffffd80;
  storage_type *in_stack_fffffffffffffda8;
  qsizetype in_stack_fffffffffffffdb0;
  storage_type *in_stack_fffffffffffffdb8;
  qsizetype in_stack_fffffffffffffdc0;
  storage_type *in_stack_fffffffffffffdc8;
  QHash<QByteArray,_QByteArray> *local_228;
  QStringBuilder<const_char_(&)[11],_QByteArray> *local_200;
  QByteArray *local_1f8;
  QStringBuilder<QStringBuilder<const_char_(&)[11],_QByteArray>,_const_char_(&)[4]> *local_1d8;
  QStringBuilder<const_char_(&)[11],_QByteArray_&> *local_1d0;
  QByteArray local_1a0 [2];
  undefined8 local_160;
  undefined8 local_158;
  undefined8 local_150;
  QByteArray local_148;
  undefined8 local_130;
  undefined8 local_128;
  undefined8 local_120;
  QByteArray local_118;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  QByteArray local_e8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  QByteArray local_b8;
  undefined8 local_90;
  storage_type *local_88;
  qsizetype local_80;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_90 = 0xaaaaaaaaaaaaaaaa;
  local_88 = in_R8;
  local_80 = in_R9;
  parseDigestAuthenticationChallenge(in_stack_fffffffffffffb10);
  *(int *)(in_RSI + 0xb0) = *(int *)(in_RSI + 0xb0) + 1;
  local_b8.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_b8.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
  local_b8.d.size = -0x5555555555555556;
  QByteArray::number((int)&local_b8,*(int *)(in_RSI + 0xb0));
  while (qVar2 = QByteArray::size(&local_b8), qVar2 < 8) {
    QByteArray::prepend(in_stack_fffffffffffffa30,(char)((ulong)in_stack_fffffffffffffa48 >> 0x38));
  }
  local_d0 = 0xaaaaaaaaaaaaaaaa;
  local_c8 = 0xaaaaaaaaaaaaaaaa;
  local_c0 = 0xaaaaaaaaaaaaaaaa;
  QByteArray::QByteArray(&local_e8,"nonce",-1);
  QHash<QByteArray,_QByteArray>::value
            (in_stack_fffffffffffffa48,(QByteArray *)in_stack_fffffffffffffa40);
  QByteArray::~QByteArray((QByteArray *)0x2075da);
  local_100 = 0xaaaaaaaaaaaaaaaa;
  local_f8 = 0xaaaaaaaaaaaaaaaa;
  local_f0 = 0xaaaaaaaaaaaaaaaa;
  QByteArray::QByteArray(&local_118,"opaque",-1);
  QHash<QByteArray,_QByteArray>::value
            (in_stack_fffffffffffffa48,(QByteArray *)in_stack_fffffffffffffa40);
  QByteArray::~QByteArray((QByteArray *)0x20764c);
  local_130 = 0xaaaaaaaaaaaaaaaa;
  local_128 = 0xaaaaaaaaaaaaaaaa;
  local_120 = 0xaaaaaaaaaaaaaaaa;
  QByteArray::QByteArray(&local_148,"qop",-1);
  QHash<QByteArray,_QByteArray>::value
            (in_stack_fffffffffffffa48,(QByteArray *)in_stack_fffffffffffffa40);
  QByteArray::~QByteArray((QByteArray *)0x2076be);
  local_160 = 0xaaaaaaaaaaaaaaaa;
  local_158 = 0xaaaaaaaaaaaaaaaa;
  local_150 = 0xaaaaaaaaaaaaaaaa;
  QByteArray::QByteArray(local_1a0,"algorithm",-1);
  QHash<QByteArray,_QByteArray>::value
            (in_stack_fffffffffffffa48,(QByteArray *)in_stack_fffffffffffffa40);
  QByteArrayView::QByteArrayView<QByteArray,_true>
            (in_stack_fffffffffffffa40,in_stack_fffffffffffffa38);
  QString::toLatin1(in_stack_fffffffffffffa28);
  QByteArrayView::QByteArrayView<QByteArray,_true>
            (in_stack_fffffffffffffa40,in_stack_fffffffffffffa38);
  QString::toLatin1(in_stack_fffffffffffffa28);
  QByteArrayView::QByteArrayView<QByteArray,_true>
            (in_stack_fffffffffffffa40,in_stack_fffffffffffffa38);
  QString::toLatin1(in_stack_fffffffffffffa28);
  QByteArrayView::QByteArrayView<QByteArray,_true>
            (in_stack_fffffffffffffa40,in_stack_fffffffffffffa38);
  QByteArrayView::QByteArrayView<QByteArray,_true>
            (in_stack_fffffffffffffa40,in_stack_fffffffffffffa38);
  QByteArrayView::QByteArrayView<QByteArray,_true>
            (in_stack_fffffffffffffa40,in_stack_fffffffffffffa38);
  QByteArrayView::QByteArrayView<QByteArray,_true>
            (in_stack_fffffffffffffa40,in_stack_fffffffffffffa38);
  QByteArrayView::QByteArrayView<QByteArray,_true>
            (in_stack_fffffffffffffa40,in_stack_fffffffffffffa38);
  QByteArray::QByteArray((QByteArray *)0x207865);
  QByteArrayView::QByteArrayView<QByteArray,_true>
            (in_stack_fffffffffffffa40,in_stack_fffffffffffffa38);
  nonceCount.m_data = in_stack_fffffffffffffd78;
  nonceCount.m_size = in_stack_fffffffffffffd70;
  cNonce.m_data = in_stack_00000008;
  cNonce.m_size = in_stack_fffffffffffffd80;
  qop_00.m_data = local_88;
  qop_00.m_size = in_stack_00000010;
  method_00.m_data = in_stack_fffffffffffffda8;
  method_00.m_size = local_80;
  digestUri.m_data = in_stack_fffffffffffffdb8;
  digestUri.m_size = in_stack_fffffffffffffdb0;
  hEntity.m_data = in_stack_fffffffffffffdc8;
  hEntity.m_size = in_stack_fffffffffffffdc0;
  digestMd5ResponseHelper
            (in_stack_fffffffffffffd20,in_stack_fffffffffffffd10,in_stack_fffffffffffffd40,
             in_stack_fffffffffffffd50,in_stack_fffffffffffffd60,nonceCount,cNonce,qop_00,method_00,
             digestUri,hEntity);
  QByteArray::~QByteArray((QByteArray *)0x20799d);
  QByteArray::~QByteArray((QByteArray *)0x2079aa);
  QByteArray::~QByteArray((QByteArray *)0x2079b7);
  QByteArray::~QByteArray((QByteArray *)0x2079c4);
  QByteArray::~QByteArray((QByteArray *)0x2079d1);
  QByteArray::~QByteArray((QByteArray *)0x2079de);
  (in_RDI->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (char *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).size = -0x5555555555555556;
  QByteArray::QByteArray((QByteArray *)0x207a13);
  QString::toLatin1((QString *)local_1d8);
  ::operator+((char (*) [11])local_200,(QByteArray *)local_1d0);
  ::operator+(local_200,(char (*) [4])local_1d0);
  ::operator+=((QByteArray *)local_1d0,local_1d8);
  QStringBuilder<QStringBuilder<const_char_(&)[11],_QByteArray>,_const_char_(&)[4]>::~QStringBuilder
            ((QStringBuilder<QStringBuilder<const_char_(&)[11],_QByteArray>,_const_char_(&)[4]> *)
             0x207a82);
  QStringBuilder<const_char_(&)[11],_QByteArray>::~QStringBuilder
            ((QStringBuilder<const_char_(&)[11],_QByteArray> *)0x207a8f);
  QByteArray::~QByteArray((QByteArray *)0x207a9c);
  QString::toLatin1((QString *)local_1d8);
  ::operator+((char (*) [8])local_200,(QByteArray *)local_1d0);
  ::operator+((QStringBuilder<const_char_(&)[8],_QByteArray> *)local_200,(char (*) [4])local_1d0);
  ::operator+=((QByteArray *)local_1d0,
               (QStringBuilder<QStringBuilder<const_char_(&)[8],_QByteArray>,_const_char_(&)[4]> *)
               local_1d8);
  QStringBuilder<QStringBuilder<const_char_(&)[8],_QByteArray>,_const_char_(&)[4]>::~QStringBuilder
            ((QStringBuilder<QStringBuilder<const_char_(&)[8],_QByteArray>,_const_char_(&)[4]> *)
             0x207b0f);
  QStringBuilder<const_char_(&)[8],_QByteArray>::~QStringBuilder
            ((QStringBuilder<const_char_(&)[8],_QByteArray> *)0x207b1c);
  QByteArray::~QByteArray((QByteArray *)0x207b29);
  local_388 = ::operator+((char (*) [8])local_1d0,(QByteArray *)local_1d8);
  ::operator+((QStringBuilder<const_char_(&)[8],_QByteArray_&> *)local_1d0,(char (*) [4])local_1d8);
  ::operator+=((QByteArray *)local_1d0,
               (QStringBuilder<QStringBuilder<const_char_(&)[8],_QByteArray_&>,_const_char_(&)[4]> *
               )local_1d8);
  local_3b0 = ::operator+((char (*) [6])local_1d0,(QByteArrayView *)local_1d8);
  ::operator+((QStringBuilder<const_char_(&)[6],_QByteArrayView_&> *)local_1d0,
              (char (*) [4])local_1d8);
  ::operator+=((QByteArray *)local_1d0,
               (QStringBuilder<QStringBuilder<const_char_(&)[6],_QByteArrayView_&>,_const_char_(&)[4]>
                *)local_1d8);
  bVar1 = QByteArray::isEmpty((QByteArray *)0x207be0);
  if (!bVar1) {
    local_3d8 = ::operator+((char (*) [9])local_1d0,(QByteArray *)local_1d8);
    ::operator+((QStringBuilder<const_char_(&)[9],_QByteArray_&> *)local_1d0,(char (*) [4])local_1d8
               );
    ::operator+=((QByteArray *)local_1d0,
                 (QStringBuilder<QStringBuilder<const_char_(&)[9],_QByteArray_&>,_const_char_(&)[4]>
                  *)local_1d8);
  }
  local_3e8 = ::operator+((char (*) [11])local_1d0,(QByteArray *)local_1d8);
  local_3e9 = 0x22;
  ::operator+(local_1d0,(char *)local_1d8);
  ::operator+=((QByteArray *)local_1d0,
               (QStringBuilder<QStringBuilder<const_char_(&)[11],_QByteArray_&>,_char> *)local_1d8);
  QByteArray::QByteArray(local_420,"algorithm",-1);
  QHash<QByteArray,_QByteArray>::value(local_228,local_1f8);
  bVar1 = QByteArray::isEmpty((QByteArray *)0x207cdc);
  QByteArray::~QByteArray((QByteArray *)0x207cf2);
  QByteArray::~QByteArray((QByteArray *)0x207cff);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    QByteArray::QByteArray(local_470,"algorithm",-1);
    QHash<QByteArray,_QByteArray>::value(local_228,local_1f8);
    ::operator+((char (*) [13])local_200,(QByteArray *)local_1d0);
    ::operator+=((QByteArray *)local_1d0,(QStringBuilder<const_char_(&)[13],_QByteArray> *)local_1d8
                );
    QStringBuilder<const_char_(&)[13],_QByteArray>::~QStringBuilder
              ((QStringBuilder<const_char_(&)[13],_QByteArray> *)0x207d85);
    QByteArray::~QByteArray((QByteArray *)0x207d92);
    QByteArray::~QByteArray((QByteArray *)0x207d9f);
  }
  QByteArray::QByteArray(local_4a0,"qop",-1);
  QHash<QByteArray,_QByteArray>::value(local_228,local_1f8);
  bVar1 = QByteArray::isEmpty((QByteArray *)0x207de4);
  QByteArray::~QByteArray((QByteArray *)0x207dfa);
  QByteArray::~QByteArray((QByteArray *)0x207e07);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    ::operator+((char (*) [7])local_1d0,(QByteArray *)local_1d8);
    ::operator+((QStringBuilder<const_char_(&)[7],_QByteArray_&> *)local_1d0,(char (*) [3])local_1d8
               );
    ::operator+=((QByteArray *)local_1d0,
                 (QStringBuilder<QStringBuilder<const_char_(&)[7],_QByteArray_&>,_const_char_(&)[3]>
                  *)local_1d8);
    ::operator+((char (*) [4])local_1d0,(QByteArray *)local_1d8);
    ::operator+((QStringBuilder<const_char_(&)[4],_QByteArray_&> *)local_1d0,(char (*) [3])local_1d8
               );
    ::operator+=((QByteArray *)local_1d0,
                 (QStringBuilder<QStringBuilder<const_char_(&)[4],_QByteArray_&>,_const_char_(&)[3]>
                  *)local_1d8);
    ::operator+((char (*) [9])local_1d0,(QByteArray *)local_1d8);
    ::operator+((QStringBuilder<const_char_(&)[9],_QByteArray_&> *)local_1d0,(char *)local_1d8);
    ::operator+=((QByteArray *)local_1d0,
                 (QStringBuilder<QStringBuilder<const_char_(&)[9],_QByteArray_&>,_char> *)local_1d8)
    ;
  }
  QByteArray::~QByteArray((QByteArray *)0x207f52);
  QByteArray::~QByteArray((QByteArray *)0x207f5f);
  QByteArray::~QByteArray((QByteArray *)0x207f6c);
  QByteArray::~QByteArray((QByteArray *)0x207f79);
  QByteArray::~QByteArray((QByteArray *)0x207f86);
  QHash<QByteArray,_QByteArray>::~QHash((QHash<QByteArray,_QByteArray> *)local_1d0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray QAuthenticatorPrivate::digestMd5Response(QByteArrayView challenge, QByteArrayView method,
                                                    QByteArrayView path)
{
    QHash<QByteArray,QByteArray> options = parseDigestAuthenticationChallenge(challenge);

    ++nonceCount;
    QByteArray nonceCountString = QByteArray::number(nonceCount, 16);
    while (nonceCountString.size() < 8)
        nonceCountString.prepend('0');

    QByteArray nonce = options.value("nonce");
    QByteArray opaque = options.value("opaque");
    QByteArray qop = options.value("qop");

//    qDebug() << "calculating digest: method=" << method << "path=" << path;
    QByteArray response = digestMd5ResponseHelper(options.value("algorithm"), user.toLatin1(),
                                              realm.toLatin1(), password.toLatin1(),
                                              nonce, nonceCountString,
                                              cnonce, qop, method,
                                              path, QByteArray());


    QByteArray credentials;
    credentials += "username=\"" + user.toLatin1() + "\", ";
    credentials += "realm=\"" + realm.toLatin1() + "\", ";
    credentials += "nonce=\"" + nonce + "\", ";
    credentials += "uri=\"" + path + "\", ";
    if (!opaque.isEmpty())
        credentials += "opaque=\"" + opaque + "\", ";
    credentials += "response=\"" + response + '"';
    if (!options.value("algorithm").isEmpty())
        credentials += ", algorithm=" + options.value("algorithm");
    if (!options.value("qop").isEmpty()) {
        credentials += ", qop=" + qop + ", ";
        credentials += "nc=" + nonceCountString + ", ";
        credentials += "cnonce=\"" + cnonce + '"';
    }

    return credentials;
}